

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-tests.cpp
# Opt level: O0

void AllocateAllAndThenRelease(bool *result)

{
  size_t sVar1;
  SimpleClass *pSVar2;
  InheritedClass *this;
  ClassWithMemAllocations *pCVar3;
  LibClass *pLVar4;
  ComplexClass *pCVar5;
  int iStack_75370;
  int i_1;
  int iStack_7535c;
  int i;
  ComplexClass *complexClassArr [10000];
  LibClass *libClassArr [10000];
  ClassWithMemAllocations *classWithMemAllocationsArr [10000];
  InheritedClass *inheritedClassArr [10000];
  SimpleClass *simpleClassArr [10000];
  SimpleStruct *simpleStructArr [10000];
  size_t sizeOfComplexClass;
  size_t sizeOfLibClass;
  size_t sizeOfClassWithMemAllocations;
  size_t sizeOfInheritedClass;
  size_t sizeOfSimpleClass;
  size_t sizeOfSimpleStruct;
  uint64_t memLeakSize;
  size_t memLeakCount;
  bool *result_local;
  
  memLeakCount = (size_t)result;
  MemPlumber::start(false,"",false);
  sVar1 = LibClass::getSizeOfInternalClass();
  for (iStack_7535c = 0; iStack_7535c < 10000; iStack_7535c = iStack_7535c + 1) {
    pSVar2 = (SimpleClass *)operator_new(8);
    pSVar2->m_DoubleMember = 0.0;
    simpleClassArr[(long)iStack_7535c + 9999] = pSVar2;
    this = (InheritedClass *)operator_new(8);
    SimpleClass::SimpleClass((SimpleClass *)this);
    inheritedClassArr[(long)iStack_7535c + 9999] = this;
    pCVar3 = (ClassWithMemAllocations *)operator_new(0x10);
    InheritedClass::InheritedClass((InheritedClass *)pCVar3);
    classWithMemAllocationsArr[(long)iStack_7535c + 9999] = pCVar3;
    pLVar4 = (LibClass *)operator_new(0x18);
    ClassWithMemAllocations::ClassWithMemAllocations((ClassWithMemAllocations *)pLVar4);
    libClassArr[(long)iStack_7535c + 9999] = pLVar4;
    pLVar4 = (LibClass *)operator_new(0x50);
    LibClass::LibClass(pLVar4);
    complexClassArr[(long)iStack_7535c + 9999] = (ComplexClass *)pLVar4;
    pCVar5 = (ComplexClass *)operator_new(0x20);
    ComplexClass::ComplexClass(pCVar5);
    *(ComplexClass **)(&stack0xfffffffffff8aca8 + (long)iStack_7535c * 8) = pCVar5;
  }
  MemPlumber::memLeakCheck(&memLeakSize,&sizeOfSimpleStruct,false,"",false);
  if (memLeakSize == 230000) {
    if (sizeOfSimpleStruct == (sVar1 + 0xf4 + sVar1 + 0x148) * 10000) {
      for (iStack_75370 = 0; iStack_75370 < 10000; iStack_75370 = iStack_75370 + 1) {
        if (simpleClassArr[(long)iStack_75370 + 9999] != (SimpleClass *)0x0) {
          operator_delete(simpleClassArr[(long)iStack_75370 + 9999],8);
        }
        if (inheritedClassArr[(long)iStack_75370 + 9999] != (InheritedClass *)0x0) {
          operator_delete(inheritedClassArr[(long)iStack_75370 + 9999],8);
        }
        pCVar3 = classWithMemAllocationsArr[(long)iStack_75370 + 9999];
        if (pCVar3 != (ClassWithMemAllocations *)0x0) {
          InheritedClass::~InheritedClass((InheritedClass *)pCVar3);
          operator_delete(pCVar3,0x10);
        }
        pLVar4 = libClassArr[(long)iStack_75370 + 9999];
        if (pLVar4 != (LibClass *)0x0) {
          ClassWithMemAllocations::~ClassWithMemAllocations((ClassWithMemAllocations *)pLVar4);
          operator_delete(pLVar4,0x18);
        }
        pLVar4 = (LibClass *)complexClassArr[(long)iStack_75370 + 9999];
        if (pLVar4 != (LibClass *)0x0) {
          LibClass::~LibClass(pLVar4);
          operator_delete(pLVar4,0x50);
        }
        pCVar5 = *(ComplexClass **)(&stack0xfffffffffff8aca8 + (long)iStack_75370 * 8);
        if (pCVar5 != (ComplexClass *)0x0) {
          ComplexClass::~ComplexClass(pCVar5);
          operator_delete(pCVar5,0x20);
        }
      }
      MemPlumber::memLeakCheck(&memLeakSize,&sizeOfSimpleStruct,false,"",false);
      if (memLeakSize == 0) {
        if (sizeOfSimpleStruct == 0) {
          MemPlumber::stopAndFreeAllMemory();
        }
        else {
          printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
                 "AllocateAllAndThenRelease",0x87,sizeOfSimpleStruct & 0xffffffff,0);
          *(undefined1 *)memLeakCount = 0;
        }
      }
      else {
        printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
               "AllocateAllAndThenRelease",0x87,memLeakSize & 0xffffffff,0);
        *(undefined1 *)memLeakCount = 0;
      }
    }
    else {
      printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
             "AllocateAllAndThenRelease",0x7b,sizeOfSimpleStruct & 0xffffffff,
             (ulong)(uint)(((int)sVar1 + 0xf4 + (int)(sVar1 + 0x148)) * 10000));
      *(undefined1 *)memLeakCount = 0;
    }
  }
  else {
    printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
           "AllocateAllAndThenRelease",0x7b,memLeakSize & 0xffffffff,230000);
    *(undefined1 *)memLeakCount = 0;
  }
  return;
}

Assistant:

TEST_CASE(AllocateAllAndThenRelease) {

    START_TEST;

    size_t sizeOfSimpleStruct = sizeof(SimpleStruct);
    size_t sizeOfSimpleClass = sizeof(SimpleClass);
    size_t sizeOfInheritedClass = sizeof(InheritedClass) + sizeof(int);
    size_t sizeOfClassWithMemAllocations = sizeof(ClassWithMemAllocations) + sizeof(int) + 12*sizeof(char) + 20*sizeof(float);
    size_t sizeOfLibClass = sizeof(LibClass) + sizeof(double) + LibClass::getSizeOfInternalClass();
    size_t sizeOfComplexClass = sizeof(ComplexClass) + 10*sizeOfSimpleStruct + sizeOfSimpleClass + sizeOfClassWithMemAllocations + sizeOfLibClass;

    SimpleStruct* simpleStructArr[NUM_OF_OBJECTS];
    SimpleClass* simpleClassArr[NUM_OF_OBJECTS];
    InheritedClass* inheritedClassArr[NUM_OF_OBJECTS];
    ClassWithMemAllocations* classWithMemAllocationsArr[NUM_OF_OBJECTS];
    LibClass* libClassArr[NUM_OF_OBJECTS];
    ComplexClass* complexClassArr[NUM_OF_OBJECTS];

    for (int i=0; i < NUM_OF_OBJECTS; i++) {
        simpleStructArr[i] = new SimpleStruct();
        simpleClassArr[i] = new SimpleClass();
        inheritedClassArr[i] = new InheritedClass();
        classWithMemAllocationsArr[i] = new ClassWithMemAllocations();
        libClassArr[i] = new LibClass();
        complexClassArr[i] = new ComplexClass();
    }

    #if !defined _MSC_VER || !defined _DEBUG
    CHECK_MEM_LEAK(NUM_OF_OBJECTS*23, NUM_OF_OBJECTS*(
        sizeOfSimpleStruct + 
        sizeOfSimpleClass + 
        sizeOfInheritedClass + 
        sizeOfClassWithMemAllocations +
        sizeOfLibClass +
        sizeOfComplexClass));
    #endif

    for (int i=0; i < NUM_OF_OBJECTS; i++) {
        delete simpleStructArr[i];
        delete simpleClassArr[i];
        delete inheritedClassArr[i];
        delete classWithMemAllocationsArr[i];
        delete libClassArr[i];
        delete complexClassArr[i];
    }

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}